

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumDescriptor.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::ENUMS::GetEnumAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ENUMS *this,EnumDescriptor *pArray,KUINT32 NumElements,
          KINT32 Value)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  KUINT32 KVar7;
  bool bVar8;
  KStringStream ss;
  stringstream asStack_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  iVar1 = (int)pArray + -1;
  iVar4 = ((int)pArray - (iVar1 >> 0x1f)) + -1 >> 1;
  lVar6 = (long)iVar4;
  KVar7 = *(KUINT32 *)(this + lVar6 * 0x10);
  bVar8 = -1 < iVar1;
  if (bVar8 && KVar7 != NumElements) {
    iVar5 = 0;
    do {
      if ((int)NumElements < (int)KVar7) {
        iVar1 = iVar4 + -1;
      }
      else {
        iVar5 = iVar4 + 1;
      }
      iVar4 = (iVar5 + iVar1) / 2;
      lVar6 = (long)iVar4;
      KVar7 = *(KUINT32 *)(this + lVar6 * 0x10);
      bVar8 = iVar5 <= iVar1;
    } while ((KVar7 != NumElements) && (iVar5 <= iVar1));
  }
  if (bVar8) {
    __s = *(char **)(this + lVar6 * 0x10 + 8);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,NumElements);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Unknown Enum: ",0xe);
    std::ostream::operator<<((ostream *)local_198,NumElements);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

KString KDIS::DATA_TYPE::ENUMS::GetEnumAsString( const EnumDescriptor * pArray, KUINT32 NumElements, KINT32 Value )
{
    KStringStream ss;
    KINT32 i32Lower = 0, i32Upper = NumElements - 1, i32Middle = ( i32Lower + i32Upper ) / 2;

    while( pArray[i32Middle].Value != Value && i32Lower <= i32Upper )
    {
        if( pArray[i32Middle].Value > Value )
        {
            // Search the left side.
            i32Upper = i32Middle - 1;
        }
        else
        {
            // Search the right side.
            i32Lower = i32Middle + 1;
        }

        i32Middle = ( i32Lower + i32Upper ) / 2;
    }

    if( i32Lower <= i32Upper )
    {
        ss << pArray[i32Middle].Name << "(" << Value << ")";
        return ss.str();
    }

    ss << "Unknown Enum: " << Value;
    return ss.str();
}